

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O3

Optional<unsigned_long> __thiscall llvm::DWARFDie::getHighPC(DWARFDie *this,uint64_t LowPC)

{
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar1;
  ulong uVar2;
  undefined8 uVar3;
  ulong uVar4;
  OptionalStorage<unsigned_long,_true> OVar5;
  Optional<unsigned_long> OVar6;
  undefined1 local_50 [8];
  Optional<llvm::DWARFFormValue> FormValue;
  
  find((Optional<llvm::DWARFFormValue> *)local_50,this,DW_AT_high_pc);
  if (FormValue.Storage.field_0._40_1_ == '\x01') {
    OVar5 = (OptionalStorage<unsigned_long,_true>)
            DWARFFormValue::getAsAddress((DWARFFormValue *)local_50);
    uVar4 = OVar5.field_0.value >> 8;
    if (((undefined1  [16])OVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if (FormValue.Storage.field_0._40_1_ == '\0') {
        __assert_fail("hasVal",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                      ,0xad,
                      "T &llvm::optional_detail::OptionalStorage<llvm::DWARFFormValue>::getValue() & [T = llvm::DWARFFormValue]"
                     );
      }
      OVar6 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_50);
      if (((undefined1  [16])OVar6.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_00d6d29c;
      aVar1.value = OVar6.Storage.field_0.value + LowPC;
      uVar4 = aVar1.value >> 8;
      OVar5._9_7_ = OVar6.Storage._9_7_;
      OVar5.hasVal = true;
      OVar5.field_0.value = aVar1.value;
    }
    uVar3 = OVar5._8_8_;
    uVar2 = (ulong)OVar5.field_0._0_1_;
  }
  else {
    uVar4 = 0;
LAB_00d6d29c:
    uVar2 = 0;
    uVar3 = 0;
  }
  OVar6.Storage._8_8_ = uVar3;
  OVar6.Storage.field_0.value = uVar4 << 8 | uVar2;
  return (Optional<unsigned_long>)OVar6.Storage;
}

Assistant:

Optional<uint64_t> DWARFDie::getHighPC(uint64_t LowPC) const {
  if (auto FormValue = find(DW_AT_high_pc)) {
    if (auto Address = FormValue->getAsAddress()) {
      // High PC is an address.
      return Address;
    }
    if (auto Offset = FormValue->getAsUnsignedConstant()) {
      // High PC is an offset from LowPC.
      return LowPC + *Offset;
    }
  }
  return None;
}